

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  FunctionProxy *pFVar7;
  ParseableFunctionInfo *pPVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar10;
  uint uVar11;
  undefined6 in_register_0000003a;
  char16_t *pcVar12;
  RegSlotType RVar13;
  undefined8 uVar9;
  
  iVar5 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar5 < 0x147) {
    if (iVar5 != 0x8c) {
      if (iVar5 == 0xd9) {
LAB_007f42ae:
        pFVar7 = ParseableFunctionInfo::GetNestedFunctionProxy
                           (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
        RVar13 = data->Value;
        uVar11 = data->Instance;
        pPVar8 = FunctionProxy::EnsureDeserialized(pFVar7);
        iVar5 = (*(pPVar8->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[7])(pPVar8);
        uVar9 = CONCAT44(extraout_var,iVar5);
        pcVar12 = L" R%d = hmo:R%d, %s()";
LAB_007f4327:
        Output::Print(pcVar12,(ulong)RVar13,(ulong)uVar11,uVar9);
        return;
      }
      if (iVar5 != 0x138) goto LAB_007f4346;
    }
LAB_007f426c:
    uVar11 = data->SlotIndex;
    uVar1 = data->Value;
    uVar2 = data->Instance;
    pcVar12 = L" R%d = R%d[%d] ";
  }
  else {
    uVar6 = (ulong)(iVar5 - 0x147U);
    if (iVar5 - 0x147U < 0x3d) {
      if ((0x380000000U >> (uVar6 & 0x3f) & 1) != 0) {
        pFVar7 = ParseableFunctionInfo::GetNestedFunctionProxy
                           (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
        RVar13 = data->Value;
        uVar11 = data->Instance;
        pPVar8 = FunctionProxy::EnsureDeserialized(pFVar7);
        iVar5 = (*(pPVar8->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[7])(pPVar8);
        uVar9 = CONCAT44(extraout_var_00,iVar5);
        pcVar12 = L" R%d = env:R%d, %s()";
        goto LAB_007f4327;
      }
      if ((0x1000000000000081U >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0x22) goto LAB_007f42ae;
        goto LAB_007f42d9;
      }
    }
    else {
LAB_007f42d9:
      if (1 < iVar5 - 0x1f7U) {
        if (iVar5 != 0x1f6) {
LAB_007f4346:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x36d,"(false)","Unknown OpCode for OpLayoutElementSlot");
          if (bVar4) {
            *puVar10 = 0;
            return;
          }
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        goto LAB_007f426c;
      }
    }
    uVar1 = data->Instance;
    uVar2 = data->SlotIndex;
    uVar11 = data->Value;
    pcVar12 = L" R%d[%d] = R%d ";
  }
  Output::Print(pcVar12,(ulong)uVar1,(ulong)uVar2,(ulong)uVar11);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlot(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewInnerStackScFunc:
            case OpCode::NewInnerScFunc:
            case OpCode::NewInnerScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = env:R%d, %s()"), data->Value, data->Instance,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            case OpCode::NewScFuncHomeObj:
            case OpCode::NewScGenFuncHomeObj:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = hmo:R%d, %s()"), data->Value, data->Instance,
                    pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
#if ENABLE_NATIVE_CODEGEN
            case OpCode::StSlot:
            case OpCode::StSlotChkUndecl:
#endif
            case OpCode::StObjSlot:
            case OpCode::StObjSlotChkUndecl:
            case OpCode::StPropIdArrFromVar:
                Output::Print(_u(" R%d[%d] = R%d "),data->Instance,data->SlotIndex,data->Value);
                break;
            case OpCode::LdSlot:
#if ENABLE_NATIVE_CODEGEN
            case OpCode::LdSlotArr:
#endif
            case OpCode::LdObjSlot:
                Output::Print(_u(" R%d = R%d[%d] "),data->Value,data->Instance,data->SlotIndex);
                break;
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlot");
                break;
            }
        }
    }